

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_file_dir.cxx
# Opt level: O3

void popup(Fl_File_Chooser *fc)

{
  Fl_Window *win;
  int iVar1;
  Fl_File_Chooser *__stat_loc;
  
  Fl_File_Chooser::show(fc);
  win = Fl::grab_;
  if (Fl::grab_ != (Fl_Window *)0x0) {
    Fl::grab((Fl_Window *)0x0);
  }
  while( true ) {
    __stat_loc = fc;
    iVar1 = Fl_File_Chooser::shown(fc);
    if (iVar1 == 0) break;
    Fl::wait(__stat_loc);
  }
  if (win != (Fl_Window *)0x0) {
    Fl::grab(win);
    return;
  }
  return;
}

Assistant:

static void popup(Fl_File_Chooser *fc) {
  fc->show();

  // deactivate Fl::grab(), because it is incompatible with modal windows
  Fl_Window* g = Fl::grab();
  if (g) Fl::grab(0);

  while (fc->shown())
    Fl::wait();

  if (g) // regrab the previous popup menu, if there was one
    Fl::grab(g);
}